

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O3

void deqp::gles2::Functional::eval_selection_bvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (0.0 < c->in[0].m_data[2]) {
    fVar1 = c->in[1].m_data[0];
    fVar2 = c->in[1].m_data[1];
    fVar4 = c->in[1].m_data[2];
    fVar3 = c->in[1].m_data[3];
  }
  else {
    fVar3 = c->in[2].m_data[0];
    fVar1 = c->in[2].m_data[1];
    fVar2 = c->in[2].m_data[2];
    fVar4 = c->in[2].m_data[3];
  }
  (c->color).m_data[0] = (float)(-(uint)(0.0 < fVar3) & 0x3f800000);
  (c->color).m_data[1] = (float)(-(uint)(0.0 < fVar4) & 0x3f800000);
  (c->color).m_data[2] = (float)(-(uint)(0.0 < fVar2) & 0x3f800000);
  (c->color).m_data[3] = (float)(-(uint)(0.0 < fVar1) & 0x3f800000);
  return;
}

Assistant:

void eval_selection_bvec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,			greaterThan(c.in[1].swizzle(3, 2, 1, 0), Vec4(0.0f, 0.0f, 0.0f, 0.0f)),	greaterThan(c.in[2].swizzle(0, 3, 2, 1), Vec4(0.0f, 0.0f, 0.0f, 0.0f))).asFloat(); }